

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Spinner.H
# Opt level: O0

int __thiscall Fl_Spinner::handle(Fl_Spinner *this,int event)

{
  int iVar1;
  int event_local;
  Fl_Spinner *this_local;
  
  if (event == 6) {
    iVar1 = Fl_Widget::take_focus((Fl_Widget *)&this->input_);
    if (iVar1 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else if ((event == 8) || (event == 0xc)) {
    iVar1 = Fl::event_key();
    if (iVar1 == 0xff52) {
      Fl_Widget::do_callback((Fl_Widget *)&this->up_button_);
      this_local._4_4_ = 1;
    }
    else {
      iVar1 = Fl::event_key();
      if (iVar1 == 0xff54) {
        Fl_Widget::do_callback((Fl_Widget *)&this->down_button_);
        this_local._4_4_ = 1;
      }
      else {
        this_local._4_4_ = 0;
      }
    }
  }
  else {
    this_local._4_4_ = Fl_Group::handle(&this->super_Fl_Group,event);
  }
  return this_local._4_4_;
}

Assistant:

int		handle(int event) {
		  switch (event) {
		    case FL_KEYDOWN :
		    case FL_SHORTCUT :
		      if (Fl::event_key() == FL_Up) {
			up_button_.do_callback();
			return 1;
		      } else if (Fl::event_key() == FL_Down) {
			down_button_.do_callback();
			return 1;
		      } else return 0;

		    case FL_FOCUS :
		      if (input_.take_focus()) return 1;
		      else return 0;
		  }

		  return Fl_Group::handle(event);
		}